

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O2

void cpu_exec_init_all_mips64el(uc_struct_conflict7 *uc)

{
  MemoryRegion *pMVar1;
  
  finalize_target_page_bits_mips64el(uc);
  pMVar1 = (MemoryRegion *)g_malloc(0xa0);
  uc->system_memory = pMVar1;
  memory_region_init_mips64el(uc,pMVar1,0xffffffffffffffff);
  address_space_init_mips64el(uc,&uc->address_space_memory,uc->system_memory);
  pMVar1 = (MemoryRegion *)g_malloc(0xa0);
  uc->system_io = pMVar1;
  memory_region_init_io_mips64el(uc,pMVar1,&unassigned_io_ops,(void *)0x0,0x10000);
  address_space_init_mips64el(uc,&uc->address_space_io,uc->system_io);
  memory_region_init_io_mips64el
            (uc,&uc->io_mem_unassigned,&unassigned_mem_ops_mips64el,(void *)0x0,0xffffffffffffffff);
  return;
}

Assistant:

void cpu_exec_init_all(struct uc_struct *uc)
{
    /* The data structures we set up here depend on knowing the page size,
     * so no more changes can be made after this point.
     * In an ideal world, nothing we did before we had finished the
     * machine setup would care about the target page size, and we could
     * do this much later, rather than requiring board models to state
     * up front what their requirements are.
     */
    finalize_target_page_bits(uc);
    memory_map_init(uc);
    io_mem_init(uc);
}